

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O1

void Abc_NodeSuperChoiceCollect2_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vVolume)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  
  if ((*(uint *)&pObj->field_0x14 & 0x40) != 0) {
    return;
  }
  *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | 0x40;
  if ((pObj->vFanins).nSize != 2) {
    __assert_fail("Abc_ObjFaninNum(pObj) == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcLut.c"
                  ,0x18c,"void Abc_NodeSuperChoiceCollect2_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  Abc_NodeSuperChoiceCollect2_rec
            ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],vVolume);
  Abc_NodeSuperChoiceCollect2_rec
            ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]],vVolume);
  uVar1 = vVolume->nCap;
  if (vVolume->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vVolume->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vVolume->pArray,0x80);
      }
      vVolume->pArray = ppvVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_002d9429;
      if (vVolume->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vVolume->pArray,(ulong)uVar1 << 4);
      }
      vVolume->pArray = ppvVar2;
    }
    vVolume->nCap = iVar3;
  }
LAB_002d9429:
  iVar3 = vVolume->nSize;
  vVolume->nSize = iVar3 + 1;
  vVolume->pArray[iVar3] = pObj;
  return;
}

Assistant:

void Abc_NodeSuperChoiceCollect2_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vVolume )
{
    if ( pObj->fMarkC )
        return;
    pObj->fMarkC = 1;
    assert( Abc_ObjFaninNum(pObj) == 2 );
    Abc_NodeSuperChoiceCollect2_rec( Abc_ObjFanin0(pObj), vVolume );
    Abc_NodeSuperChoiceCollect2_rec( Abc_ObjFanin1(pObj), vVolume );
    Vec_PtrPush( vVolume, pObj );
}